

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyConfig.cpp
# Opt level: O2

bool __thiscall ProxyConfig::initWithFile(ProxyConfig *this,string *configFile)

{
  FILE *__stream;
  ulong uVar1;
  Ch *str;
  ulong __size;
  
  if (((this->m_isInit == false) && (configFile->_M_string_length != 0)) &&
     (__stream = fopen((configFile->_M_dataplus)._M_p,"rb"), __stream != (FILE *)0x0)) {
    fseek(__stream,0,2);
    uVar1 = ftell(__stream);
    __size = uVar1 & 0xffffffff;
    if (__size != 0) {
      str = (Ch *)operator_new__((ulong)((int)uVar1 + 1));
      fseek(__stream,0,0);
      fread(str,__size,1,__stream);
      fclose(__stream);
      str[__size] = '\0';
      rapidjson::
      GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
      ::Parse<0u,rapidjson::UTF8<char>>
                ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                  *)this,str,__size);
      operator_delete__(str);
      if ((this->m_document).parseResult_.code_ == kParseErrorNone) {
        this->m_isInit = true;
        return true;
      }
      printf("json parse error: %u");
      return false;
    }
    fclose(__stream);
  }
  return false;
}

Assistant:

bool ProxyConfig::initWithFile(const std::string& configFile)
{
	if (m_isInit)
	{
		return false;
	}
	if (configFile.empty())
	{
		return false;
	}

	FILE* fp = fopen(configFile.c_str(), "rb");
	if (fp == NULL)
	{
		return false;
	}

	fseek(fp, 0, SEEK_END);
	uint32_t fileSize = ftell(fp);

	if (fileSize <= 0)
	{
		fclose(fp);
		return false;
	}

	char* buf = new char[fileSize + 1];
	fseek(fp, 0, SEEK_SET);
	fread(buf, fileSize, 1, fp);
	fclose(fp);

	buf[fileSize] = '\0';

	m_document.Parse(buf, fileSize);
	delete[] buf;

	if (m_document.HasParseError())
	{
		printf("json parse error: %u", m_document.GetParseError());
		return false;
	}
	m_isInit = true;
	return true;
}